

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImGuiViewportP *pIVar2;
  ImVec2 *pIVar3;
  ImVec2 *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiPlatformMonitor *pIVar6;
  ImVec2 *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImRect IVar14;
  
  pIVar5 = GImGui;
  if (window->ViewportAllowPlatformMonitorExtend < 0) {
    pIVar2 = window->Viewport;
    pIVar7 = &(pIVar2->super_ImGuiViewport).Pos;
    fVar13 = (pIVar2->super_ImGuiViewport).Pos.x + (pIVar2->super_ImGuiViewport).Size.x;
    pIVar3 = &(pIVar2->super_ImGuiViewport).Pos;
    pIVar4 = &(pIVar2->super_ImGuiViewport).Size;
  }
  else {
    pIVar6 = ImVector<ImGuiPlatformMonitor>::operator[]
                       (&(GImGui->PlatformIO).Monitors,window->ViewportAllowPlatformMonitorExtend);
    pIVar7 = &pIVar6->WorkPos;
    fVar13 = (pIVar6->WorkPos).x + (pIVar6->WorkSize).x;
    pIVar3 = &pIVar6->WorkPos;
    pIVar4 = &pIVar6->WorkSize;
  }
  fVar8 = pIVar3->y + pIVar4->y;
  IVar1 = (pIVar5->Style).DisplaySafeAreaPadding;
  fVar9 = (*pIVar7).x;
  fVar10 = (*pIVar7).y;
  fVar11 = IVar1.x;
  fVar12 = IVar1.y;
  fVar11 = (float)((uint)-fVar11 & -(uint)(fVar11 + fVar11 < fVar13 - fVar9));
  fVar12 = (float)((uint)-fVar12 & -(uint)(fVar12 + fVar12 < fVar8 - fVar10));
  IVar14.Min.x = fVar9 - fVar11;
  IVar14.Min.y = fVar10 - fVar12;
  IVar14.Max.x = fVar11 + fVar13;
  IVar14.Max.y = fVar12 + fVar8;
  return IVar14;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen.Min = window->Viewport->Pos;
        r_screen.Max = window->Viewport->Pos + window->Viewport->Size;
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}